

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O0

void __thiscall bubbleJson::BubbleJson::EncodeUTF8(BubbleJson *this,uint number)

{
  byte ch;
  uint number_local;
  BubbleJson *this_local;
  
  ch = (byte)number;
  if (number < 0x80) {
    ContextPushChar(this,ch);
  }
  else if (number < 0x800) {
    ContextPushChar(this,(byte)(number >> 6) | 0xc0);
    ContextPushChar(this,ch & 0x3f | 0x80);
  }
  else if (number < 0x10000) {
    ContextPushChar(this,(byte)(number >> 0xc) | 0xe0);
    ContextPushChar(this,(byte)(number >> 6) & 0x3f | 0x80);
    ContextPushChar(this,ch & 0x3f | 0x80);
  }
  else if (number < 0x110000) {
    ContextPushChar(this,(byte)(number >> 0x12) | 0xf0);
    ContextPushChar(this,(byte)(number >> 0xc) & 0x3f | 0x80);
    ContextPushChar(this,(byte)(number >> 6) & 0x3f | 0x80);
    ContextPushChar(this,ch & 0x3f | 0x80);
  }
  return;
}

Assistant:

void BubbleJson::EncodeUTF8(unsigned number)
{
    if (number <= 0x7F)
        ContextPushChar(number & 0xFF);
    else if (number <= 0x7FF)
    {
        ContextPushChar(0xC0 | ((number >> 6) & 0xFF));
        ContextPushChar(0x80 | ((number) & 0x3F));
    }
    else if (number <= 0xFFFF)
    {
        ContextPushChar(0xE0 | ((number >> 12) & 0xFF));
        ContextPushChar(0x80 | ((number >> 6) & 0x3F));
        ContextPushChar(0x80 | ((number) & 0x3F));
    }
    else if (number <= 0x10FFFF)
    {
        ContextPushChar(0xF0 | ((number >> 18) & 0xFF));
        ContextPushChar(0x80 | ((number >> 12) & 0x3F));
        ContextPushChar(0x80 | ((number >> 6) & 0x3F));
        ContextPushChar(0x80 | ((number) & 0x3F));
    }
}